

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O1

int enet_address_get_host_ip(ENetAddress *address,char *name,size_t nameLength)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  
  __s = inet_ntoa((in_addr)address->host);
  if (__s == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    sVar2 = strlen(__s);
    if (sVar2 < nameLength) {
      memcpy(name,__s,sVar2 + 1);
    }
    iVar1 = (sVar2 < nameLength) - 1;
  }
  return iVar1;
}

Assistant:

int
enet_address_get_host_ip (const ENetAddress * address, char * name, size_t nameLength)
{
#ifdef HAS_INET_NTOP
    if (inet_ntop (AF_INET, & address -> host, name, nameLength) == NULL)
#else
    char * addr = inet_ntoa (* (struct in_addr *) & address -> host);
    if (addr != NULL)
    {
        size_t addrLen = strlen(addr);
        if (addrLen >= nameLength)
          return -1;
        memcpy (name, addr, addrLen + 1);
    } 
    else
#endif
        return -1;
    return 0;
}